

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void check_array_opt<zmq::sockopt::array_option<72,1>>
               (socket_base *param_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
               byte param_3)

{
  MessageBuilder *pMVar1;
  bool bVar2;
  Decomposer local_311;
  ExprLhs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_310;
  enable_if_t<Detail::conjunction<Detail::is_eq_comparable<basic_string<char>_&,_const_basic_string<char>_&>,_Detail::negation<capture_by_value<std::remove_reference_t<const_basic_string<char>_&>_>_>_>::value,_BinaryExpr<basic_string<char>_&,_const_basic_string<char>_&>_>
  local_308;
  StringRef local_2d8;
  SourceLineInfo local_2c8;
  StringRef local_2b8;
  undefined1 local_2a8 [8];
  AssertionHandler catchAssertionHandler;
  undefined1 local_258 [8];
  string s;
  SourceLineInfo local_218;
  StringRef local_208;
  MessageBuilder local_1f8;
  undefined1 local_1a0 [8];
  ScopedMessage scopedMessage13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  SourceLineInfo local_128;
  StringRef local_118;
  MessageBuilder local_108;
  undefined1 local_b0 [8];
  ScopedMessage scopedMessage12;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string val;
  bool set_only_local;
  string *info_local;
  socket_t *sock_local;
  
  val.field_2._M_local_buf[0xf] = param_3 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,"foobar",&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_118 = operator____catch_sr("INFO",4);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
             0x61);
  Catch::MessageBuilder::MessageBuilder(&local_108,local_118,&local_128,Info);
  std::operator+(&local_148,"setting ",param_2);
  pMVar1 = Catch::MessageBuilder::operator<<(&local_108,&local_148);
  Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_b0,pMVar1);
  std::__cxx11::string::~string((string *)&local_148);
  Catch::MessageBuilder::~MessageBuilder(&local_108);
  zmq::detail::socket_base::set<72,1>(param_1,local_48);
  bVar2 = (val.field_2._M_local_buf[0xf] & 1U) == 0;
  if (bVar2) {
    local_208 = operator____catch_sr("INFO",4);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
               0x66);
    Catch::MessageBuilder::MessageBuilder(&local_1f8,local_208,&local_218,Info);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&s.field_2 + 8),"getting ",param_2);
    pMVar1 = Catch::MessageBuilder::operator<<
                       (&local_1f8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&s.field_2 + 8));
    Catch::ScopedMessage::ScopedMessage((ScopedMessage *)local_1a0,pMVar1);
    std::__cxx11::string::~string((string *)(s.field_2._M_local_buf + 8));
    Catch::MessageBuilder::~MessageBuilder(&local_1f8);
    zmq::detail::socket_base::get<72,1>(local_258,param_1,0x400);
    local_2b8 = operator____catch_sr("CHECK",5);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/tests/socket.cpp",
               0x68);
    local_2d8 = operator____catch_sr("s == val",8);
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)local_2a8,local_2b8,&local_2c8,local_2d8,ContinueOnFailure);
    local_310 = Catch::
                operator<=<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
                          (&local_311,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_258);
    Catch::operator==(&local_308,&local_310,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48)
    ;
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)local_2a8,&local_308.super_ITransientExpression);
    Catch::
    BinaryExpr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~BinaryExpr(&local_308);
    Catch::AssertionHandler::complete((AssertionHandler *)local_2a8);
    Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_2a8);
    std::__cxx11::string::~string((string *)local_258);
    Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_1a0);
  }
  scopedMessage13._73_3_ = 0;
  scopedMessage13.m_moved = !bVar2;
  Catch::ScopedMessage::~ScopedMessage((ScopedMessage *)local_b0);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void check_array_opt(T opt,
                     zmq::socket_t &sock,
                     std::string info,
                     bool set_only = false)
{
    const std::string val = "foobar";
    INFO("setting " + info);
    sock.set(opt, val);
    if (set_only)
        return;

    INFO("getting " + info);
    auto s = sock.get(opt);
    CHECK(s == val);
}